

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O0

LY_ERR lyd_validate_module(lyd_node **tree,lys_module *module,uint32_t val_opts,lyd_node **diff)

{
  ly_ctx *plVar1;
  ly_ctx *local_50;
  ly_ctx *local_48;
  ly_ctx *local_40;
  ly_ctx *local_38;
  lyd_node **diff_local;
  uint32_t val_opts_local;
  lys_module *module_local;
  lyd_node **tree_local;
  
  if (tree == (lyd_node **)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","tree",
           "lyd_validate_module");
    tree_local._4_4_ = LY_EINVAL;
  }
  else if (module == (lys_module *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","module",
           "lyd_validate_module");
    tree_local._4_4_ = LY_EINVAL;
  }
  else if ((val_opts & 2) == 0) {
    if (*tree != (lyd_node *)0x0) {
      if ((*tree)->schema == (lysc_node *)0x0) {
        plVar1 = (ly_ctx *)(*tree)[2].schema;
      }
      else {
        plVar1 = (*tree)->schema->module->ctx;
      }
      if ((plVar1 != (ly_ctx *)0x0) && (module->ctx != (ly_ctx *)0x0)) {
        if (*tree == (lyd_node *)0x0) {
          local_40 = (ly_ctx *)0x0;
        }
        else {
          if ((*tree)->schema == (lysc_node *)0x0) {
            local_38 = (ly_ctx *)(*tree)[2].schema;
          }
          else {
            local_38 = (*tree)->schema->module->ctx;
          }
          local_40 = local_38;
        }
        if (local_40 != module->ctx) {
          if (*tree == (lyd_node *)0x0) {
            local_50 = (ly_ctx *)0x0;
          }
          else {
            if ((*tree)->schema == (lysc_node *)0x0) {
              local_48 = (ly_ctx *)(*tree)[2].schema;
            }
            else {
              local_48 = (*tree)->schema->module->ctx;
            }
            local_50 = local_48;
          }
          ly_log(local_50,LY_LLERR,LY_EINVAL,"Different contexts mixed in a single function call.");
          return LY_EINVAL;
        }
      }
    }
    if (diff != (lyd_node **)0x0) {
      *diff = (lyd_node *)0x0;
    }
    tree_local._4_4_ =
         lyd_validate(tree,module,module->ctx,val_opts,'\x01',(ly_set *)0x0,(ly_set *)0x0,
                      (ly_set *)0x0,(ly_set *)0x0,(ly_set *)0x0,diff);
  }
  else {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","!(val_opts & 0x0002)",
           "lyd_validate_module");
    tree_local._4_4_ = LY_EINVAL;
  }
  return tree_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_validate_module(struct lyd_node **tree, const struct lys_module *module, uint32_t val_opts, struct lyd_node **diff)
{
    LY_CHECK_ARG_RET(NULL, tree, module, !(val_opts & LYD_VALIDATE_PRESENT), LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(*tree ? LYD_CTX(*tree) : NULL, module->ctx, LY_EINVAL);
    if (diff) {
        *diff = NULL;
    }

    return lyd_validate(tree, module, module->ctx, val_opts, 1, NULL, NULL, NULL, NULL, NULL, diff);
}